

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O2

void __thiscall RenX::Server::setPrefix(Server *this,string_view prefix)

{
  string tagged_prefix;
  allocator<char> local_41;
  string local_40;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = prefix._M_str;
  local_20._M_len = prefix._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_40,&local_20,&local_41);
  sanitizeTags(&local_40);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->m_IRCPrefix,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void RenX::Server::setPrefix(std::string_view prefix) {
	// TODO: pass in std::string here instead
	std::string tagged_prefix = static_cast<std::string>(prefix);
	RenX::sanitizeTags(tagged_prefix);
	m_IRCPrefix = tagged_prefix;
}